

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

l_mem singlestep(lua_State *L,int fast)

{
  global_State *g_00;
  int iVar1;
  l_mem local_30;
  l_mem stepresult;
  global_State *g;
  int fast_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  g_00->gcstopem = '\x01';
  switch(g_00->gcstate) {
  case '\0':
    if ((fast == 0) && (g_00->gray != (GCObject *)0x0)) {
      local_30 = propagatemark(g_00);
    }
    else {
      g_00->gcstate = '\x01';
      local_30 = 1;
    }
    break;
  case '\x01':
    atomic(L);
    iVar1 = checkmajorminor(L,g_00);
    if (iVar1 == 0) {
      entersweep(L);
      local_30 = -2;
    }
    else {
      local_30 = -1;
    }
    break;
  default:
    return 0;
  case '\x03':
    sweepstep(L,g_00,'\x04',&g_00->finobj,fast);
    local_30 = 0x14;
    break;
  case '\x04':
    sweepstep(L,g_00,'\x05',&g_00->tobefnz,fast);
    local_30 = 0x14;
    break;
  case '\x05':
    sweepstep(L,g_00,'\x06',(GCObject **)0x0,fast);
    local_30 = 0x14;
    break;
  case '\x06':
    checkSizes(L,g_00);
    g_00->gcstate = '\a';
    local_30 = 0x14;
    break;
  case '\a':
    if ((g_00->tobefnz == (GCObject *)0x0) || (g_00->gcemergency != '\0')) {
      g_00->gcstate = '\b';
      local_30 = -3;
    }
    else {
      g_00->gcstopem = '\0';
      GCTM(L);
      local_30 = 10;
    }
    break;
  case '\b':
    restartcollection(g_00);
    g_00->gcstate = '\0';
    local_30 = 1;
  }
  g_00->gcstopem = '\0';
  return local_30;
}

Assistant:

static l_mem singlestep (lua_State *L, int fast) {
  global_State *g = G(L);
  l_mem stepresult;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      stepresult = 1;
      break;
    }
    case GCSpropagate: {
      if (fast || g->gray == NULL) {
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        stepresult = 1;
      }
      else
        stepresult = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      atomic(L);
      if (checkmajorminor(L, g))
        stepresult = step2minor;
      else {
        entersweep(L);
        stepresult = atomicstep;
      }
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      sweepstep(L, g, GCSswpfinobj, &g->finobj, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      sweepstep(L, g, GCSswptobefnz, &g->tobefnz, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      sweepstep(L, g, GCSswpend, NULL, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCScallfin: {  /* call finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        GCTM(L);  /* call one finalizer */
        stepresult = CWUFIN;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        stepresult = step2pause;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return stepresult;
}